

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

void __thiscall
chrono::ChOptimizerGenetic::PopulationStats
          (ChOptimizerGenetic *this,double *average,double *max,double *min,double *stdeviation)

{
  double dVar1;
  uint uVar2;
  ChGenotype **ppCVar3;
  ChGenotype *pCVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  *average = 0.0;
  auVar12._8_8_ = 0x7fffffffffffffff;
  auVar12._0_8_ = 0x7fffffffffffffff;
  *max = -999999999.0;
  *min = 999999999.0;
  *stdeviation = 0.0;
  uVar2 = *(uint *)&(this->super_ChOptimizer).field_0x144;
  ppCVar3 = this->population;
  uVar7 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
  iVar8 = 0;
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pCVar4 = ppCVar3[uVar9];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = pCVar4->fitness;
    auVar13 = vandpd_avx(auVar14,auVar12);
    if ((auVar13._0_8_ != 999999.0) || (NAN(auVar13._0_8_))) {
      *average = pCVar4->fitness + *average;
      dVar11 = pCVar4->fitness;
      if (*max < dVar11) {
        *max = dVar11;
        dVar11 = pCVar4->fitness;
      }
      iVar8 = iVar8 + 1;
      if (dVar11 < *min) {
        *min = dVar11;
      }
    }
  }
  dVar11 = *average;
  uVar9 = 0;
  dVar10 = 0.0;
  *average = dVar11 / (double)iVar8;
  while (uVar7 != uVar9) {
    ppCVar3 = this->population + uVar9;
    uVar9 = uVar9 + 1;
    dVar1 = (*ppCVar3)->fitness;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar1;
    auVar13 = vandpd_avx(auVar15,auVar12);
    dVar1 = dVar1 - dVar11 / (double)iVar8;
    uVar5 = vcmpsd_avx512f(auVar13,ZEXT816(0x412e847e00000000),4);
    bVar6 = (bool)((byte)uVar5 & 1);
    dVar10 = (double)((ulong)bVar6 * (long)(dVar10 + dVar1 * dVar1) + (ulong)!bVar6 * (long)dVar10);
  }
  auVar13._0_8_ = dVar10 / (double)(iVar8 + -1);
  auVar13._8_8_ = 0;
  if (auVar13._0_8_ < 0.0) {
    dVar11 = sqrt(auVar13._0_8_);
  }
  else {
    auVar12 = vsqrtsd_avx(auVar13,auVar13);
    dVar11 = auVar12._0_8_;
  }
  *stdeviation = dVar11;
  return;
}

Assistant:

void ChOptimizerGenetic::PopulationStats(double& average, double& max, double& min, double& stdeviation) {
    average = 0;
    max = -999999999;
    min = +999999999;
    stdeviation = 0;
    double variance = 0;
    int i;
    int sumind = 0;

    for (i = 0; i < popsize; i++) {
        if (fabs(population[i]->fitness) != OPT_IMPOSSIBLE) {
            sumind++;
            average += population[i]->fitness;
            if (population[i]->fitness > max)
                max = population[i]->fitness;
            if (population[i]->fitness < min)
                min = population[i]->fitness;
        }
    }
    average = average / (double)sumind;

    for (i = 0; i < popsize; i++) {
        if (fabs(population[i]->fitness) != OPT_IMPOSSIBLE) {
            variance += pow((population[i]->fitness - average), 2);
        }
    }
    variance = variance / (double)(sumind - 1);
    stdeviation = sqrt(variance);
}